

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O1

void __thiscall
Fossilize::FeatureFilter::Impl::unregister_shader_module_info(Impl *this,VkShaderModule module)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  int iVar3;
  ulong uVar4;
  _Node_iterator_base<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_false>
  __it;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  __hash_code __code;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->module_to_info_lock);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  uVar1 = (this->module_to_info)._M_h._M_bucket_count;
  uVar4 = (ulong)module % uVar1;
  p_Var5 = (this->module_to_info)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, (VkShaderModule)p_Var5->_M_nxt[1]._M_nxt != module))
  {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, (VkShaderModule)p_Var2[1]._M_nxt == module)) goto LAB_00110daa;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_00110daa:
  if (p_Var6 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var6->_M_nxt;
  }
  if (__it._M_cur != (__node_type *)0x0) {
    std::
    _Hashtable<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_std::allocator<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->module_to_info)._M_h,(const_iterator)__it._M_cur);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->module_to_info_lock);
  return;
}

Assistant:

void FeatureFilter::Impl::unregister_shader_module_info(VkShaderModule module)
{
	std::lock_guard<std::mutex> holder{module_to_info_lock};
	auto itr = module_to_info.find(module);
	if (itr != module_to_info.end())
		module_to_info.erase(itr);
}